

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall
FIX::DataDictionary::addGroup
          (DataDictionary *this,string *msg,int field,int delim,DataDictionary *dataDictionary)

{
  DataDictionary *this_00;
  mapped_type *this_01;
  pair<int,_FIX::DataDictionary_*> pVar1;
  pair<int,_FIX::DataDictionary_*> local_78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>
  *local_68;
  FieldPresenceMap *presenceMap;
  DataDictionary *local_30;
  DataDictionary *pDD;
  DataDictionary *dataDictionary_local;
  int delim_local;
  int field_local;
  string *msg_local;
  DataDictionary *this_local;
  
  pDD = dataDictionary;
  dataDictionary_local._0_4_ = delim;
  dataDictionary_local._4_4_ = field;
  _delim_local = msg;
  msg_local = (string *)this;
  this_00 = (DataDictionary *)operator_new(0x3e0);
  DataDictionary(this_00,pDD);
  local_30 = this_00;
  getVersion_abi_cxx11_((string *)&presenceMap,this);
  setVersion(this_00,(string *)&presenceMap);
  std::__cxx11::string::~string((string *)&presenceMap);
  local_68 = std::
             map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>_>_>_>
             ::operator[](&this->m_groups,(key_type *)((long)&dataDictionary_local + 4));
  pVar1 = std::make_pair<int&,FIX::DataDictionary*&>((int *)&dataDictionary_local,&local_30);
  local_78.second = pVar1.second;
  local_78.first = pVar1.first;
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>
            ::operator[](local_68,_delim_local);
  std::pair<int,_FIX::DataDictionary_*>::operator=(this_01,&local_78);
  return;
}

Assistant:

void addGroup(const std::string &msg, int field, int delim, const DataDictionary &dataDictionary) {
    DataDictionary *pDD = new DataDictionary(dataDictionary);
    pDD->setVersion(getVersion());

    FieldPresenceMap &presenceMap = m_groups[field];
    presenceMap[msg] = std::make_pair(delim, pDD);
  }